

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::XmlReporter::benchmarkPreparing(XmlReporter *this,string *name)

{
  allocator<char> local_5a;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"BenchmarkResults",&local_59);
  XmlWriter::startElement(&this->m_xml,&local_38,Newline|Indent);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"name",&local_5a);
  XmlWriter::writeAttribute(&this->m_xml,&local_58,name);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void XmlReporter::benchmarkPreparing(std::string const &name) {
        m_xml.startElement("BenchmarkResults")
            .writeAttribute("name", name);
    }